

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  undefined1 auVar1 [12];
  CURLMcode CVar2;
  Curl_tree *pCVar3;
  Curl_easy *data;
  CURLMcode CVar4;
  curltime i;
  curltime now;
  curltime cVar5;
  Curl_tree *t;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  cVar5 = Curl_now();
  CVar4 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) &&
     (CVar4 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    data = multi->easyp;
    auVar1 = cVar5._0_12_;
    if (data == (Curl_easy *)0x0) {
      CVar4 = CURLM_OK;
    }
    else {
      CVar4 = CURLM_OK;
      do {
        sigpipe_ignore(data,(sigpipe_ignore *)local_d0);
        cVar5._12_4_ = 0;
        cVar5.tv_sec = auVar1._0_8_;
        cVar5.tv_usec = auVar1._8_4_;
        CVar2 = multi_runsingle(multi,cVar5,data);
        if (local_38 == '\0') {
          sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
        }
        if (CVar2 != CURLM_OK) {
          CVar4 = CVar2;
        }
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    do {
      i._12_4_ = 0;
      i.tv_sec = auVar1._0_8_;
      i.tv_usec = auVar1._8_4_;
      pCVar3 = Curl_splaygetbest(i,multi->timetree,(Curl_tree **)&local_d0[0].sa_handler);
      multi->timetree = pCVar3;
      if (local_d0[0].sa_handler != (__sighandler_t)0x0) {
        now._12_4_ = 0;
        now.tv_sec = auVar1._0_8_;
        now.tv_usec = auVar1._8_4_;
        add_next_timeout(now,multi,*(Curl_easy **)(local_d0[0].sa_handler + 0x30));
      }
    } while (local_d0[0].sa_handler != (__sighandler_t)0x0);
    *running_handles = multi->num_alive;
    if (CVar4 < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    update_timer(multi);

  return returncode;
}